

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

size_t utf8_strlen(char *s)

{
  size_t j;
  
  j = 0;
  for (; *s != '\0'; s = s + 1) {
    j = j + 1;
  }
  return j;
}

Assistant:

size_t utf8_strlen(const char *s)
{
	size_t i = 0, j = 0;
	while (s[i]) {
		if ((s[i] & 0xc0) != 0x80) j++;
		i++;
	}
	return j;
}